

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fairprice.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  ulong uVar2;
  runtime_error *this;
  long lVar3;
  char *pcVar4;
  int local_18;
  int local_14;
  int guess;
  int round;
  int number;
  
  round = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"-----------------");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," Fair price game");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"-----------------");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"The number to guess is a random one under ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  poVar1 = std::operator<<(poVar1," and ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1000);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  guess = random_int();
  local_14 = 1;
  do {
    while( true ) {
      while( true ) {
        std::operator<<((ostream *)&std::cout,"Your guess: ");
        std::istream::operator>>((istream *)&std::cin,&local_18);
        uVar2 = std::ios::eof();
        if ((uVar2 & 1) != 0) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"Input stream has been closed!");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar2 = std::ios::fail();
        if ((uVar2 & 1) == 0) break;
        poVar1 = std::operator<<((ostream *)&std::cout,"Invalid input. Try again!");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
        lVar3 = std::numeric_limits<long>::max();
        std::istream::ignore((long)&std::cin,(int)lVar3);
      }
      if ((-1 < local_18) && (local_18 < 0x3e9)) break;
      poVar1 = std::operator<<((ostream *)&std::cout,"Number out of range (range: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
      poVar1 = std::operator<<(poVar1,"-");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,1000);
      poVar1 = std::operator<<(poVar1,"). Try again.");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    if (local_18 < guess) {
      poVar1 = std::operator<<((ostream *)&std::cout,"More.");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    else {
      if (local_18 <= guess) {
        poVar1 = std::operator<<((ostream *)&std::cout,"That\'s it! The random number was ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,guess);
        poVar1 = std::operator<<(poVar1,".");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<(poVar1,"You win in ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
        poVar1 = std::operator<<(poVar1," round");
        pcVar4 = ".";
        if (1 < local_14) {
          pcVar4 = "s.";
        }
        poVar1 = std::operator<<(poVar1,pcVar4);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        return 0;
      }
      poVar1 = std::operator<<((ostream *)&std::cout,"Less.");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int main() {
    std::cout 
        << "-----------------" << std::endl
        << " Fair price game" << std::endl
        << "-----------------" << std::endl
        << std::endl
        << "The number to guess is a random one under " << min << " and " << max << std::endl
        << std::endl;

    const int number = random_int();
    int round = 1;

    while (true) {
        int guess;
        std::cout << "Your guess: ";
        std::cin >> guess;

        if (std::cin.eof()) {
            throw std::runtime_error("Input stream has been closed!");
        } else
        if (std::cin.fail()) {
            std::cout << "Invalid input. Try again!" << std::endl;
            std::cin.clear();
            std::cin.ignore(std::numeric_limits<std::streamsize>::max(), '\n');
        } else {
            if (guess < min || guess > max) {
                std::cout << "Number out of range (range: " << min << "-" << max << "). Try again." << std::endl;
            } else {
                if (guess < number) {
                    std::cout << "More." << std::endl;
                } else
                if (guess > number) {
                    std::cout << "Less." << std::endl;
                } else {
                    std::cout << "That's it! The random number was " << number << "." << std::endl
                        << "You win in " << round << " round" << ((round > 1) ? "s." : ".") << std::endl;
                    break;
                }
                ++round;
            }
        }
    }
    return EXIT_SUCCESS;
}